

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O0

void __thiscall
Memory::InlineCacheAllocator::ClearCacheIfHasDeadWeakRefs
          (InlineCacheAllocator *this,Recycler *recycler,CacheLayout *cache)

{
  ulong uVar1;
  bool bVar2;
  intptr_t curWeakRef;
  intptr_t *curWeakRefPtr;
  CacheLayout *cache_local;
  Recycler *recycler_local;
  InlineCacheAllocator *this_local;
  
  curWeakRef = (intptr_t)cache;
  while( true ) {
    if (&cache->strongRef <= (ulong)curWeakRef) {
      return;
    }
    uVar1 = *(ulong *)curWeakRef;
    if (((uVar1 != 0) && ((uVar1 & 0xb) == 0)) &&
       (bVar2 = Recycler::IsObjectMarked(recycler,(void *)(uVar1 & 0xfffffffffffffffb)), !bVar2))
    break;
    curWeakRef = curWeakRef + 8;
  }
  cache->weakRefs[0] = 0;
  cache->weakRefs[1] = 0;
  cache->weakRefs[2] = 0;
  return;
}

Assistant:

void InlineCacheAllocator::ClearCacheIfHasDeadWeakRefs(Recycler* recycler, CacheLayout* cache)
{
    for (intptr_t* curWeakRefPtr = cache->weakRefs; curWeakRefPtr < &cache->strongRef; curWeakRefPtr++)
    {
        intptr_t curWeakRef = *curWeakRefPtr;

        if (curWeakRef == 0)
        {
            continue;
        }

        curWeakRef &= ~(intptr_t)InlineCacheAuxSlotTypeTag;

        if ((curWeakRef & (HeapConstants::ObjectGranularity - 1)) != 0)
        {
            continue;
        }

        if (!recycler->IsObjectMarked((void*)curWeakRef))
        {
            cache->weakRefs[0] = 0;
            cache->weakRefs[1] = 0;
            cache->weakRefs[2] = 0;
            break;
        }
    }
}